

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clnt_internal.h
# Opt level: O0

void clnt_data_destroy(cx_data *cx)

{
  char *pcVar1;
  size_t sVar2;
  cx_data *cx_local;
  
  pthread_mutex_destroy((pthread_mutex_t *)&(cx->cx_c).cl_lock);
  if (((cx->cx_c).cl_netid != (char *)0x0) && (*(cx->cx_c).cl_netid != '\0')) {
    pcVar1 = (cx->cx_c).cl_netid;
    sVar2 = strlen((cx->cx_c).cl_netid);
    mem_free(pcVar1,sVar2 + 1);
  }
  if (((cx->cx_c).cl_tp != (char *)0x0) && (*(cx->cx_c).cl_tp != '\0')) {
    pcVar1 = (cx->cx_c).cl_tp;
    sVar2 = strlen((cx->cx_c).cl_tp);
    mem_free(pcVar1,sVar2 + 1);
  }
  return;
}

Assistant:

static inline void
clnt_data_destroy(struct cx_data *cx)
{
	mutex_destroy(&cx->cx_c.cl_lock);

	/* note seemingly pointers to constant ""? */
	if (cx->cx_c.cl_netid && cx->cx_c.cl_netid[0])
		mem_free(cx->cx_c.cl_netid, strlen(cx->cx_c.cl_netid) + 1);
	if (cx->cx_c.cl_tp && cx->cx_c.cl_tp[0])
		mem_free(cx->cx_c.cl_tp, strlen(cx->cx_c.cl_tp) + 1);
}